

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O3

void __thiscall OpenMesh::PolyConnectivity::reinsert_edge(PolyConnectivity *this,EdgeHandle _eh)

{
  BaseHandle BVar1;
  BaseHandle _fh;
  HalfedgeHandle _heh;
  HalfedgeHandle _heh_00;
  HalfedgeHandle _heh_01;
  HalfedgeHandle _heh_02;
  HalfedgeHandle _heh_03;
  undefined4 _fh_00;
  reference pvVar2;
  Halfedge *pHVar3;
  Face *pFVar4;
  BaseHandle _heh_04;
  undefined1 local_60 [8];
  FaceHalfedgeIter fh_it;
  
  pvVar2 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                     ((BaseKernel *)this,
                      (EPropHandleT<OpenMesh::Attributes::StatusInfo>)
                      (this->super_ArrayKernel).edge_status_.
                      super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_,
                      (EdgeHandle)_eh.super_BaseHandle.idx_);
  if ((pvVar2->status_ & 1) == 0) {
    __assert_fail("status(_eh).deleted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x3a1,"void OpenMesh::PolyConnectivity::reinsert_edge(EdgeHandle)");
  }
  pvVar2 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                     ((BaseKernel *)this,
                      (EPropHandleT<OpenMesh::Attributes::StatusInfo>)
                      (this->super_ArrayKernel).edge_status_.
                      super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_,
                      (EdgeHandle)_eh.super_BaseHandle.idx_);
  *(byte *)&pvVar2->status_ = (byte)pvVar2->status_ & 0xfe;
  _heh_03.super_BaseHandle.idx_ = (BaseHandle)((int)_eh.super_BaseHandle.idx_ * 2);
  _heh_04.idx_ = (int)_eh.super_BaseHandle.idx_ * 2 + 1;
  pHVar3 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_03);
  BVar1.idx_ = (pHVar3->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
  pHVar3 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)_heh_04.idx_);
  _fh.idx_ = (pHVar3->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = BVar1.idx_;
  if (_fh.idx_ == -1) {
    fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = -1;
    _fh.idx_ = BVar1.idx_;
  }
  pvVar2 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                     ((BaseKernel *)this,
                      (FPropHandleT<OpenMesh::Attributes::StatusInfo>)
                      (this->super_ArrayKernel).face_status_.
                      super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_,
                      (FaceHandle)_fh.idx_);
  if ((pvVar2->status_ & 1) == 0) {
    __assert_fail("status(del_fh).deleted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x3ab,"void OpenMesh::PolyConnectivity::reinsert_edge(EdgeHandle)");
  }
  pvVar2 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                     ((BaseKernel *)this,
                      (FPropHandleT<OpenMesh::Attributes::StatusInfo>)
                      (this->super_ArrayKernel).face_status_.
                      super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_,
                      (FaceHandle)_fh.idx_);
  *(byte *)&pvVar2->status_ = (byte)pvVar2->status_ & 0xfe;
  pHVar3 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_03);
  _heh.super_BaseHandle.idx_ = (BaseHandle)(pHVar3->prev_halfedge_handle_).super_BaseHandle.idx_;
  pHVar3 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)_heh_04.idx_);
  _heh_00.super_BaseHandle.idx_ = (BaseHandle)(pHVar3->prev_halfedge_handle_).super_BaseHandle.idx_;
  pHVar3 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_03);
  _heh_01.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar3->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_
  ;
  pHVar3 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)_heh_04.idx_);
  _heh_02.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar3->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_
  ;
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh,_heh_03);
  ArrayKernel::set_prev_halfedge_handle(&this->super_ArrayKernel,_heh_01,_heh_03);
  ArrayKernel::set_next_halfedge_handle
            (&this->super_ArrayKernel,_heh_00,(HalfedgeHandle)_heh_04.idx_);
  ArrayKernel::set_prev_halfedge_handle
            (&this->super_ArrayKernel,_heh_02,(HalfedgeHandle)_heh_04.idx_);
  pFVar4 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh.idx_);
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ =
       (pFVar4->halfedge_handle_).super_BaseHandle.idx_;
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_ =
       (BaseHandle)0x0;
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
       (BaseHandle)0xffffffff;
  local_60 = (undefined1  [8])this;
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ =
       fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_;
  if (fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ != -1) {
    do {
      if ((fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ ==
           fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
         (fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
          idx_ != 0)) break;
      pHVar3 = ArrayKernel::halfedge
                         (&this->super_ArrayKernel,
                          (HalfedgeHandle)
                          fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_
                         );
      (pHVar3->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ = _fh.idx_;
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                    *)local_60);
    } while (fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1);
  }
  _fh_00 = fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_;
  pFVar4 = ArrayKernel::face(&this->super_ArrayKernel,
                             (FaceHandle)
                             fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_);
  pHVar3 = ArrayKernel::halfedge
                     (&this->super_ArrayKernel,
                      (HalfedgeHandle)(pFVar4->halfedge_handle_).super_BaseHandle.idx_);
  if ((pHVar3->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == _fh.idx_) {
    pFVar4 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh_00);
    if (((BaseHandle)(pFVar4->halfedge_handle_).super_BaseHandle.idx_ != _heh.super_BaseHandle.idx_)
       && (pFVar4 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh_00),
          _heh_04.idx_ = (int)_heh_03.super_BaseHandle.idx_,
          (BaseHandle)(pFVar4->halfedge_handle_).super_BaseHandle.idx_ !=
          _heh_00.super_BaseHandle.idx_)) {
      __assert_fail("halfedge_handle(rem_fh) == prev_heh1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                    ,0x3c8,"void OpenMesh::PolyConnectivity::reinsert_edge(EdgeHandle)");
    }
    pFVar4 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh_00);
    (pFVar4->halfedge_handle_).super_BaseHandle.idx_ = _heh_04.idx_;
  }
  return;
}

Assistant:

void PolyConnectivity::reinsert_edge(EdgeHandle _eh)
{
  //this does not work without prev_halfedge_handle
  assert_compile(sizeof(Halfedge) == sizeof(Halfedge_with_prev));
  //shoudl be deleted  
  assert(status(_eh).deleted());
  status(_eh).set_deleted(false);  
  
  HalfedgeHandle heh0 = halfedge_handle(_eh, 0);
  HalfedgeHandle heh1 = halfedge_handle(_eh, 1);
  FaceHandle rem_fh = face_handle(heh0), del_fh = face_handle(heh1);
  if (!del_fh.is_valid())
  {//boundary case - we must delete the rem_fh
    std::swap(del_fh, rem_fh);
  }
  assert(status(del_fh).deleted());
  status(del_fh).set_deleted(false); 
  
  //restore halfedge relations
  HalfedgeHandle prev_heh0 = prev_halfedge_handle(heh0);
  HalfedgeHandle prev_heh1 = prev_halfedge_handle(heh1);

  HalfedgeHandle next_heh0 = next_halfedge_handle(heh0);
  HalfedgeHandle next_heh1 = next_halfedge_handle(heh1);
  
  set_next_halfedge_handle(prev_heh0, heh0);
  set_prev_halfedge_handle(next_heh0, heh0);
  
  set_next_halfedge_handle(prev_heh1, heh1);
  set_prev_halfedge_handle(next_heh1, heh1);
  
  for (FaceHalfedgeIter fh_it = fh_iter(del_fh); fh_it.is_valid(); ++fh_it)
  {//reassign halfedges to del_fh  
    set_face_handle(*fh_it, del_fh);
  }
   
  if (face_handle(halfedge_handle(rem_fh)) == del_fh)
  {//correct the halfedge handle of rem_fh
    if (halfedge_handle(rem_fh) == prev_heh0)
    {//rem_fh is the face at heh1
      set_halfedge_handle(rem_fh, heh1);
    }
    else
    {//rem_fh is the face at heh0
      assert(halfedge_handle(rem_fh) == prev_heh1);
      set_halfedge_handle(rem_fh, heh0);
    }
  }
}